

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtest.c
# Opt level: O1

int xpathCommonTest(char *filename,char *result,int xptr,int expr)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  char *__filename;
  FILE *__stream;
  char *pcVar4;
  size_t sVar5;
  ulong uVar6;
  long lVar7;
  undefined8 uVar8;
  long lVar9;
  int extraout_EDX;
  char *pcVar10;
  char expression [5000];
  undefined8 local_13c0;
  char local_13b8 [5000];
  
  pcVar4 = temp_directory;
  pcVar10 = filename;
  __filename = resultFilename(filename,temp_directory,".res");
  iVar3 = (int)pcVar4;
  if (__filename == (char *)0x0) {
    xpathCommonTest_cold_1();
    nb_tests = nb_tests + 1;
    lVar7 = xmlXPathNewContext(xpathDocument);
    xmlXPathSetErrorHandler(lVar7,testStructuredErrorHandler,0);
    if (iVar3 == 0) {
      uVar8 = xmlDocGetRootElement(xpathDocument);
      *(undefined8 *)(lVar7 + 8) = uVar8;
      if (extraout_EDX == 0) {
        lVar9 = xmlXPathCompile(pcVar10);
        if (lVar9 == 0) {
          uVar8 = 0;
        }
        else {
          uVar8 = xmlXPathCompiledEval(lVar9,lVar7);
          xmlXPathFreeCompExpr(lVar9);
        }
      }
      else {
        uVar8 = xmlXPathEvalExpression(pcVar10,lVar7);
      }
    }
    else {
      uVar8 = xmlXPtrEval(pcVar10,lVar7);
    }
    xmlXPathDebugDumpObject(xpathOutput,uVar8,0);
    xmlXPathFreeObject(uVar8);
    iVar3 = xmlXPathFreeContext(lVar7);
    return iVar3;
  }
  xpathOutput = (FILE *)fopen64(__filename,"wb");
  if ((FILE *)xpathOutput == (FILE *)0x0) {
    pcVar4 = "failed to open output file %s\n";
    filename = __filename;
  }
  else {
    local_13c0 = result;
    __stream = fopen64(filename,"rb");
    if (__stream != (FILE *)0x0) {
      pcVar4 = fgets(local_13b8,0x1194,__stream);
      if (pcVar4 != (char *)0x0) {
        do {
          sVar5 = strlen(local_13b8);
          if (0 < (int)(uint)sVar5) {
            uVar6 = (ulong)((uint)sVar5 & 0x7fffffff);
            do {
              if ((0x20 < (ulong)(byte)local_13b8[uVar6 - 1]) ||
                 ((0x100002600U >> ((ulong)(byte)local_13b8[uVar6 - 1] & 0x3f) & 1) == 0)) {
                local_13b8[uVar6 & 0xffffffff] = '\0';
                fprintf((FILE *)xpathOutput,"\n========================\nExpression: %s\n",
                        local_13b8);
                testXPath(local_13b8,xptr,expr);
                goto LAB_0010e327;
              }
              sVar5 = uVar6 - 1;
              bVar1 = 1 < (long)uVar6;
              uVar6 = sVar5;
            } while (bVar1);
          }
          local_13b8[(int)sVar5] = '\0';
LAB_0010e327:
          pcVar4 = fgets(local_13b8,0x1194,__stream);
        } while (pcVar4 != (char *)0x0);
      }
      fclose(__stream);
      fclose((FILE *)xpathOutput);
      pcVar4 = local_13c0;
      iVar3 = 0;
      if ((local_13c0 != (char *)0x0) &&
         (iVar2 = compareFiles(__filename,local_13c0), iVar3 = 0, iVar2 != 0)) {
        fprintf(_stderr,"Result for %s failed in %s\n",filename,pcVar4);
        iVar3 = iVar2;
      }
      unlink(__filename);
      goto LAB_0010e3a3;
    }
    pcVar4 = "Cannot open %s for reading\n";
  }
  fprintf(_stderr,pcVar4,filename);
  iVar3 = -1;
LAB_0010e3a3:
  free(__filename);
  return iVar3;
}

Assistant:

static int
xpathCommonTest(const char *filename, const char *result,
                int xptr, int expr) {
    FILE *input;
    char expression[5000];
    int len, ret = 0;
    char *temp;

    temp = resultFilename(filename, temp_directory, ".res");
    if (temp == NULL) {
        fprintf(stderr, "Out of memory\n");
        fatalError();
    }
    xpathOutput = fopen(temp, "wb");
    if (xpathOutput == NULL) {
	fprintf(stderr, "failed to open output file %s\n", temp);
        free(temp);
	return(-1);
    }

    input = fopen(filename, "rb");
    if (input == NULL) {
        fprintf(stderr,
		"Cannot open %s for reading\n", filename);
        free(temp);
	return(-1);
    }
    while (fgets(expression, 4500, input) != NULL) {
	len = strlen(expression);
	len--;
	while ((len >= 0) &&
	       ((expression[len] == '\n') || (expression[len] == '\t') ||
		(expression[len] == '\r') || (expression[len] == ' '))) len--;
	expression[len + 1] = 0;
	if (len >= 0) {
	    fprintf(xpathOutput,
	            "\n========================\nExpression: %s\n",
		    expression) ;
	    testXPath(expression, xptr, expr);
	}
    }

    fclose(input);
    fclose(xpathOutput);
    if (result != NULL) {
	ret = compareFiles(temp, result);
	if (ret) {
	    fprintf(stderr, "Result for %s failed in %s\n", filename, result);
	}
    }

    if (temp != NULL) {
        unlink(temp);
        free(temp);
    }
    return(ret);
}